

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitDataDrop(BinaryInstWriter *this,DataDrop *curr)

{
  BufferWithRandomAccess *this_00;
  U32LEB x;
  
  BufferWithRandomAccess::operator<<(this->o,-4);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)0x9);
  this_00 = this->o;
  x.value = WasmBinaryWriter::getDataSegmentIndex
                      (this->parent,(Name)(curr->segment).super_IString.str);
  BufferWithRandomAccess::operator<<(this_00,x);
  return;
}

Assistant:

void BinaryInstWriter::visitDataDrop(DataDrop* curr) {
  o << int8_t(BinaryConsts::MiscPrefix);
  o << U32LEB(BinaryConsts::DataDrop);
  o << U32LEB(parent.getDataSegmentIndex(curr->segment));
}